

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> __thiscall
Parser::parseComparisonExpression(Parser *this)

{
  _Head_base<0UL,_ExpressionNode_*,_false> in_RDI;
  function<bool_(const_Token_&)> *in_stack_00000028;
  function<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_()>
  *in_stack_00000030;
  Parser *in_stack_00000038;
  _Bind<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*(Parser_*))()>
  *__f;
  function<bool_(const_Token_&)> *this_00;
  _Bind<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*(Parser_*))()>
  local_48 [3];
  
  __f = local_48;
  this_00 = (function<bool_(const_Token_&)> *)in_RDI._M_head_impl;
  std::
  bind<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>(Parser::*)(),Parser*>
            (&__f->_M_f,(Parser **)in_RDI._M_head_impl);
  std::function<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>()>::
  function<std::_Bind<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>(Parser::*(Parser*))()>,void>
            ((function<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_()> *)
             this_00,__f);
  std::function<bool(Token_const&)>::function<bool(&)(Token_const&),void>
            (this_00,(_func_bool_Token_ptr *)__f);
  parseExpression(in_stack_00000038,in_stack_00000030,in_stack_00000028);
  std::function<bool_(const_Token_&)>::~function((function<bool_(const_Token_&)> *)0x19c5b9);
  std::function<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_()>::~function
            ((function<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_()> *)
             0x19c5c6);
  return (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         (tuple<ExpressionNode_*,_std::default_delete<ExpressionNode>_>)in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<ExpressionNode> Parser::parseComparisonExpression()
{
  return parseExpression(std::bind(&Parser::parseArithmeticExpression, this), Token::isComparisonOperator);
}